

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimstate.cpp
# Opt level: O0

void __thiscall BtorSimState::update(BtorSimState *this,BtorSimState *s)

{
  BtorSimState *in_RSI;
  BtorSimState *in_RDI;
  BtorSimBitVector *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RDI->type == BITVEC) {
    update(in_RDI,in_stack_ffffffffffffffd8);
  }
  else if (in_RDI->type == ARRAY) {
    update(in_RSI,(BtorSimArrayModel *)CONCAT44(2,in_stack_ffffffffffffffe8));
  }
  else {
    die("Updating invalid state!");
  }
  return;
}

Assistant:

void
BtorSimState::update (BtorSimState &s)
{
  switch (type)
  {
    case ARRAY:
      assert (s.type == ARRAY);
      update (s.array_state);
      break;
    case BtorSimState::Type::BITVEC:
      assert (s.type == BITVEC);
      update (s.bv_state);
      break;
    default: die ("Updating invalid state!");
  }
}